

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O2

size_t fs_to_winpath(char *path,char *result,size_t buffer_size)

{
  size_t sVar1;
  size_type sVar2;
  string_view s;
  string_view path_00;
  string local_40;
  
  sVar1 = strlen(path);
  path_00._M_str = path;
  path_00._M_len = sVar1;
  fs_to_winpath_abi_cxx11_(&local_40,path_00);
  s._M_str = local_40._M_dataplus._M_p;
  s._M_len = local_40._M_string_length;
  sVar2 = fs_str2char(s,result,buffer_size);
  std::__cxx11::string::~string((string *)&local_40);
  return sVar2;
}

Assistant:

size_t fs_to_winpath(const char* path, char* result, const size_t buffer_size){
  return fs_str2char(fs_to_winpath(path), result, buffer_size);
}